

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArrayBase::FindMinOrMax
          (TypedArrayBase *this,ScriptContext *scriptContext,TypeId typeId,bool findMax)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *scriptContext_00;
  undefined4 *puVar3;
  bool findMax_local;
  TypeId typeId_local;
  ScriptContext *scriptContext_local;
  TypedArrayBase *this_local;
  
  bVar2 = IsDetachedBuffer(this);
  if (bVar2) {
    scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  switch(typeId) {
  case TypeIds_Int8Array:
    this_local = (TypedArrayBase *)FindMinOrMax<char,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Uint8Array:
  case TypeIds_Uint8ClampedArray:
    this_local = (TypedArrayBase *)FindMinOrMax<unsigned_char,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Int16Array:
    this_local = (TypedArrayBase *)FindMinOrMax<short,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Uint16Array:
    this_local = (TypedArrayBase *)FindMinOrMax<unsigned_short,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Int32Array:
    this_local = (TypedArrayBase *)FindMinOrMax<int,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Uint32Array:
    this_local = (TypedArrayBase *)FindMinOrMax<unsigned_int,false>(this,scriptContext,findMax);
    break;
  case TypeIds_Float32Array:
    this_local = (TypedArrayBase *)FindMinOrMax<float,true>(this,scriptContext,findMax);
    break;
  case TypeIds_Float64Array:
    this_local = (TypedArrayBase *)FindMinOrMax<double,true>(this,scriptContext,findMax);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9dd,"(false)","Unsupported array for fast path");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local = (TypedArrayBase *)0x0;
  }
  return this_local;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, TypeId typeId, bool findMax)
    {
        if (this->IsDetachedBuffer()) // 9.4.5.8 IntegerIndexedElementGet
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
        }

        switch (typeId)
        {
        case TypeIds_Int8Array:
            return this->FindMinOrMax<int8, false>(scriptContext, findMax);

        case TypeIds_Uint8Array:
        case TypeIds_Uint8ClampedArray:
            return this->FindMinOrMax<uint8, false>(scriptContext, findMax);

        case TypeIds_Int16Array:
            return this->FindMinOrMax<int16, false>(scriptContext, findMax);

        case TypeIds_Uint16Array:
            return this->FindMinOrMax<uint16, false>(scriptContext, findMax);

        case TypeIds_Int32Array:
            return this->FindMinOrMax<int32, false>(scriptContext, findMax);

        case TypeIds_Uint32Array:
            return this->FindMinOrMax<uint32, false>(scriptContext, findMax);

        case TypeIds_Float32Array:
            return this->FindMinOrMax<float, true>(scriptContext, findMax);

        case TypeIds_Float64Array:
            return this->FindMinOrMax<double, true>(scriptContext, findMax);

        default:
            AssertMsg(false, "Unsupported array for fast path");
            return nullptr;
        }
    }